

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O2

void cprefx(int pm)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  permonst *pm_00;
  char kbuf [256];
  
  maybe_cannibal(pm,'\x01');
  pm_00 = mons + pm;
  if (pm == 0xc) {
    if (u.uprops[8].extrinsic == 0) goto LAB_0018ee50;
  }
  else {
    if ((pm == 0xb || pm == 0x127) && (u.uprops[8].extrinsic == 0)) {
LAB_0018ee50:
      if ((((byte)youmonst.mintrinsics & 0x80) == 0) &&
         ((bVar1 = poly_when_stoned(youmonst.data), bVar1 == '\0' ||
          (iVar2 = polymon(0x108), iVar2 == 0)))) {
        pcVar3 = mons_mname(pm_00);
        pline("You bite into %s meat.",pcVar3);
        pcVar3 = mons_mname(pm_00);
        sprintf(kbuf,"tasting %s meat",pcVar3);
        bVar1 = delayed_petrify((char *)0x0,kbuf);
        if ((bVar1 != '\0') && (victual.piece != (obj *)0x0)) {
          victual._20_1_ = victual._20_1_ & 0xfb;
          return;
        }
        if (bVar1 != '\0') {
          return;
        }
      }
    }
    if (((uint)pm < 0x28) && ((0x8c001c0000U >> ((ulong)(uint)pm & 0x3f) & 1) != 0)) {
      if (urole.malenum == 0x15b) {
        return;
      }
      if (urace.malenum == 0x4a) {
        return;
      }
      if (urace.malenum == 0xe8) {
        return;
      }
      pcVar3 = mons_mname(pm_00);
      pline("You feel that eating the %s was a bad idea.",pcVar3);
      u.uprops[0x14].intrinsic._3_1_ = u.uprops[0x14].intrinsic._3_1_ | 4;
      return;
    }
    if (pm - 0x144U < 3) {
      pline("Eating that is instantly fatal.");
      pcVar3 = mons_mname(pm_00);
      sprintf(kbuf,"unwisely ate the body of %s",pcVar3);
      killer_format = 2;
      killer = kbuf;
      done(0);
      bVar1 = revive_corpse(victual.piece);
      if (bVar1 == '\0') {
        return;
      }
      victual.piece = (obj *)0x0;
      return;
    }
    if (pm == 0xd7) {
      if ((youmonst.data != mons + 0xd7 &&
          (youmonst.data != mons + 0x157 &&
          (youmonst.data != mons + 0xa0 &&
          (youmonst.data != mons + 0x20 && youmonst.data != mons + 0x73)))) &&
          ((u.uprops[0x3d].intrinsic == 0 && u.uprops[0x3a].intrinsic == 0) &&
          u.uprops[0x3d].extrinsic == 0)) {
        pline("You don\'t feel very well.");
        u.uprops[0x3a].intrinsic = 10;
        iflags.botl = '\x01';
      }
    }
    else if (pm == 0x154) goto LAB_0018ee05;
  }
  if ((mons[pm].mflags1 & 0x8000000) == 0) {
    return;
  }
LAB_0018ee05:
  if (u.uprops[0x21].intrinsic != 0) {
    fix_petrification();
  }
  return;
}

Assistant:

static void cprefx(int pm)
{
	maybe_cannibal(pm,TRUE);
	if (touch_petrifies(&mons[pm]) || pm == PM_MEDUSA) {
	    if (!Stone_resistance &&
		!(poly_when_stoned(youmonst.data) && polymon(PM_STONE_GOLEM))) {
		char kbuf[BUFSZ];
		pline("You bite into %s meat.", mons_mname(&mons[pm]));
		sprintf(kbuf, "tasting %s meat", mons_mname(&mons[pm]));
		if (delayed_petrify(NULL, kbuf)) {
		    if (victual.piece)
			victual.eating = FALSE;
		    return; /* lifesaved */
		}
	    }
	}

	switch(pm) {
	    case PM_LITTLE_DOG:
	    case PM_DOG:
	    case PM_LARGE_DOG:
	    case PM_KITTEN:
	    case PM_HOUSECAT:
	    case PM_LARGE_CAT:
		if (!CANNIBAL_ALLOWED()) {
		    pline("You feel that eating the %s was a bad idea.", mons_mname(&mons[pm]));
		    HAggravate_monster |= FROMOUTSIDE;
		}
		break;
	    case PM_LIZARD:
		if (Stoned) fix_petrification();
		break;
	    case PM_DEATH:
	    case PM_PESTILENCE:
	    case PM_FAMINE:
		{ char buf[BUFSZ];
		    pline("Eating that is instantly fatal.");
		    sprintf(buf, "unwisely ate the body of %s",
			    mons_mname(&mons[pm]));
		    killer = buf;
		    killer_format = NO_KILLER_PREFIX;
		    done(DIED);
		    /* It so happens that since we know these monsters */
		    /* cannot appear in tins, victual.piece will always */
		    /* be what we want, which is not generally true. */
		    if (revive_corpse(victual.piece))
			victual.piece = NULL;
		    return;
		}
	    case PM_GREEN_SLIME:
		if (!Slimed && !Unchanging && !flaming(youmonst.data) &&
			youmonst.data != &mons[PM_GREEN_SLIME]) {
		    pline("You don't feel very well.");
		    Slimed = 10L;
		    iflags.botl = 1;
		}
		/* Fall through */
	    default:
		if (acidic(&mons[pm]) && Stoned)
		    fix_petrification();
		break;
	}
}